

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O1

int __thiscall
Imf_3_4::Compressor::uncompress(Compressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  Box2i *pBVar1;
  uint64_t uVar2;
  Box2i local_38;
  
  pBVar1 = Header::dataWindow(this->_header);
  local_38.min.x = (pBVar1->min).x;
  local_38.max.x = (pBVar1->max).x;
  local_38.max.y = minY + this->_numScanLines + -1;
  local_38.min.y = minY;
  uVar2 = runDecodeStep(this,inPtr,inSize,&local_38,outPtr);
  return (int)uVar2;
}

Assistant:

int
Compressor::uncompress (
    const char* inPtr, int inSize, int minY, const char*& outPtr)
{
    IMATH_NAMESPACE::Box2i range = _header.dataWindow ();

    range.min.y = minY;
    range.max.y = minY + _numScanLines - 1;

    return static_cast<int> (
        runDecodeStep (inPtr, inSize, range, outPtr));
}